

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qetag.c
# Opt level: O0

Qiniu_Error Qiniu_Qetag_allocateBlock(_Qiniu_Qetag_Context *ctx,_Qiniu_Qetag_Block **blk)

{
  _Qiniu_Qetag_Block *p_Var1;
  Qiniu_Digest *pQVar2;
  Qiniu_Error QVar3;
  _Qiniu_Qetag_Block *newBlk;
  _Qiniu_Qetag_Block **blk_local;
  _Qiniu_Qetag_Context *ctx_local;
  Qiniu_Error err;
  
  if (ctx->blkUnused == 0) {
    QVar3 = Qiniu_Qetag_mergeBlocks(ctx);
    err._0_8_ = QVar3.message;
    ctx_local = (_Qiniu_Qetag_Context *)(ulong)(uint)QVar3.code;
    if (QVar3.code != 200) goto LAB_0011b65d;
    if (ctx->blkUnused == 0) {
      *blk = (_Qiniu_Qetag_Block *)0x0;
      ctx_local = (_Qiniu_Qetag_Context *)0x2707;
      err._0_8_ = anon_var_dwarf_bb15;
      goto LAB_0011b65d;
    }
  }
  p_Var1 = ctx->blkArray + ctx->blkEnd;
  pQVar2 = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
  p_Var1->sha1Digest = pQVar2;
  if (p_Var1->sha1Digest == (Qiniu_Digest *)0x0) {
    ctx_local = (_Qiniu_Qetag_Context *)0x270f;
    err._0_8_ = anon_var_dwarf_badd;
  }
  else {
    p_Var1->field_0 =
         (anon_struct_4_3_eb54787e_for__Qiniu_Qetag_Block_0)((uint)p_Var1->field_0 & 0xff7fffff);
    p_Var1->field_0 =
         (anon_struct_4_3_eb54787e_for__Qiniu_Qetag_Block_0)
         ((uint)p_Var1->field_0 & 0xff800000 | 0x400000);
    ctx->blkUnused = ctx->blkUnused - 1;
    ctx->blkEnd = ctx->blkEnd + 1;
    if (ctx->blkElementCount <= ctx->blkEnd) {
      ctx->blkEnd = 0;
    }
    *blk = p_Var1;
    ctx_local = (_Qiniu_Qetag_Context *)0xc8;
    err._0_8_ = anon_var_dwarf_bac7;
  }
LAB_0011b65d:
  QVar3.message = (char *)err._0_8_;
  QVar3._0_8_ = ctx_local;
  return QVar3;
}

Assistant:

static Qiniu_Error Qiniu_Qetag_allocateBlock(struct _Qiniu_Qetag_Context * ctx, struct _Qiniu_Qetag_Block ** blk)
{
    Qiniu_Error err;
    struct _Qiniu_Qetag_Block * newBlk = NULL;

    if (ctx->blkUnused == 0) {
        err = Qiniu_Qetag_mergeBlocks(ctx);
        if (err.code != 200) {
            return err;
        }

        if (ctx->blkUnused == 0) {
            *blk = NULL;
            err.code = 9991;
            err.message = "no enough blocks";
            return err;
        } // if
    } // if

    newBlk = &ctx->blkArray[ctx->blkEnd];
	newBlk->sha1Digest = Qiniu_Digest_New(QINIU_DIGEST_TYPE_SHA1);
	if (newBlk->sha1Digest == NULL) {
		err.code = 9999;
		err.message = "openssl internal error";
		return err;
	}

    newBlk->done = NO;
    newBlk->capacity = BLOCK_MAX_SIZE;

    ctx->blkUnused -= 1;
    ctx->blkEnd += 1;
    if (ctx->blkEnd >= ctx->blkElementCount) {
        ctx->blkEnd = 0;
    }

    *blk = newBlk;
    err.code = 200;
    err.message = "ok";
    return err;
}